

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
::write_decimal<int>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
           *this,int value)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  size_type sVar2;
  undefined1 *puVar3;
  byte bVar4;
  long lVar5;
  uint uVar6;
  ptrdiff_t _Num;
  ulong __n;
  uint uVar7;
  ulong uVar8;
  pointer __dest;
  char_type buffer [13];
  undefined1 local_35 [13];
  
  uVar8 = (ulong)(uint)-value;
  if (0 < value) {
    uVar8 = (ulong)(uint)value;
  }
  uVar7 = (uint)uVar8;
  uVar6 = 0x1f;
  if ((uVar7 | 1) != 0) {
    for (; (uVar7 | 1) >> uVar6 == 0; uVar6 = uVar6 - 1) {
    }
  }
  uVar6 = (uVar6 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
  uVar6 = (uVar6 - (uVar7 < *(uint *)(internal::basic_data<void>::ZERO_OR_POWERS_OF_10_32 +
                                     (ulong)uVar6 * 4))) + 1;
  __n = (ulong)uVar6;
  pbVar1 = (this->out_).container;
  sVar2 = pbVar1->_M_string_length;
  std::__cxx11::string::resize((ulong)pbVar1,((char)sVar2 - (char)(value >> 0x1f)) + (char)uVar6);
  __dest = (pbVar1->_M_dataplus)._M_p + sVar2;
  if (value < 0) {
    *__dest = '-';
    __dest = __dest + 1;
  }
  puVar3 = local_35 + __n;
  if (99 < uVar7) {
    do {
      uVar6 = (uint)uVar8;
      uVar7 = (uint)(uVar8 / 100);
      uVar8 = uVar8 / 100;
      *(undefined2 *)(puVar3 + -2) =
           *(undefined2 *)
            (internal::basic_data<void>::DIGITS + (ulong)(uVar6 + (int)uVar8 * -100) * 2);
      puVar3 = puVar3 + -2;
    } while (9999 < uVar6);
  }
  if (uVar7 < 10) {
    bVar4 = (byte)uVar7 | 0x30;
    lVar5 = -1;
  }
  else {
    puVar3[-1] = internal::basic_data<void>::DIGITS[((ulong)uVar7 * 2 & 0xffffffff) + 1];
    bVar4 = internal::basic_data<void>::DIGITS[(ulong)uVar7 * 2];
    lVar5 = -2;
  }
  puVar3[lVar5] = bVar4;
  if (__n != 0) {
    memcpy(__dest,local_35,__n);
  }
  return;
}

Assistant:

void write_decimal(Int value) {
    typedef typename internal::int_traits<Int>::main_type main_type;
    main_type abs_value = static_cast<main_type>(value);
    bool is_negative = internal::is_negative(value);
    if (is_negative)
      abs_value = 0 - abs_value;
    int num_digits = internal::count_digits(abs_value);
    auto &&it = reserve((is_negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (is_negative)
      *it++ = static_cast<char_type>('-');
    it = internal::format_decimal<char_type>(it, abs_value, num_digits);
  }